

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_logging_unittest.cc
# Opt level: O2

int main(int param_1,char **param_2)

{
  uint *puVar1;
  _Safe_iterator_base *p_Var2;
  bool bVar3;
  string *psVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  mapped_type *pmVar8;
  char *pcVar9;
  char *pcVar10;
  undefined1 local_268 [8];
  ostringstream ss;
  undefined1 auStack_e8 [8];
  vector<int,_std::allocator<int>_> v;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> copied_v;
  CheckOpString local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__debug::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_e8);
  local_268._0_4_ = 10;
  std::__debug::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)local_268);
  local_268._0_4_ = 0x14;
  std::__debug::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)local_268);
  local_268._0_4_ = 0x1e;
  std::__debug::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)local_268);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
  operator<<((ostream *)local_268,(vector<int,_std::allocator<int>_> *)auStack_e8);
  std::__cxx11::stringbuf::str();
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0,"10 20 30");
  std::__cxx11::string::~string((string *)local_a0);
  if (bVar3) {
    std::__debug::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_a0,
               (vector<int,_std::allocator<int>_> *)auStack_e8);
    psVar4 = google::
             Check_EQImpl<std::__debug::vector<int,std::allocator<int>>,std::__debug::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)auStack_e8,
                        (vector<int,_std::allocator<int>_> *)local_a0,"v == copied_v");
    if (psVar4 != (string *)0x0) {
      local_58.str_ = psVar4;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                 ,0x55,&local_58);
      google::LogMessage::stream((LogMessage *)&local_50);
      goto LAB_001171c4;
    }
    std::__debug::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)local_a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
    std::__debug::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)auStack_e8);
    v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&v.super_vector<int,_std::allocator<int>_>;
    local_268._0_4_ = 0x14;
    auStack_e8 = (undefined1  [8])0x0;
    v.
    super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
    .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
    super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
    v.
    super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
    .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
    super__Safe_sequence_base._M_const_iterators._0_4_ = 1;
    v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar1 = &v.
              super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
              .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
              super__Safe_sequence_base._M_version;
    v.
    super__Safe_vector<std::__debug::vector<int,_std::allocator<int>_>,_std::__cxx1998::vector<int,_std::allocator<int>_>_>
    ._M_guaranteed_capacity =
         (size_type)
         v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    pmVar5 = std::__cxx1998::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)puVar1,(key_type *)local_268);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (pmVar5,"twenty");
    local_268._0_4_ = 10;
    pmVar5 = std::__cxx1998::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)puVar1,(key_type *)local_268);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (pmVar5,"ten");
    local_268._0_4_ = 0x1e;
    pmVar5 = std::__cxx1998::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)puVar1,(key_type *)local_268);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (pmVar5,"thirty");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
    operator<<((ostream *)local_268,
               (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)auStack_e8);
    std::__cxx11::stringbuf::str();
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"(10, ten) (20, twenty) (30, thirty)");
    std::__cxx11::string::~string((string *)local_a0);
    if (bVar3) {
      std::__debug::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_a0,
            (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)auStack_e8);
      psVar4 = google::
               Check_EQImpl<std::__debug::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>,std::__debug::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                         ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)auStack_e8,
                          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,"m == copied_m");
      if (psVar4 != (string *)0x0) {
        local_58.str_ = psVar4;
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                   ,0x62,&local_58);
        google::LogMessage::stream((LogMessage *)&local_50);
        goto LAB_001171c4;
      }
      std::__debug::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
      std::__debug::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)auStack_e8);
      __gnu_cxx::hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
      hash_set((hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               auStack_e8);
      local_a0._0_4_ = 10;
      __gnu_cxx::hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
      insert((pair<__gnu_cxx::_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
              *)local_268,
             (hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             auStack_e8,(value_type *)local_a0);
      local_a0._0_4_ = 0x14;
      __gnu_cxx::hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
      insert((pair<__gnu_cxx::_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
              *)local_268,
             (hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             auStack_e8,(value_type *)local_a0);
      local_a0._0_4_ = 0x1e;
      __gnu_cxx::hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
      insert((pair<__gnu_cxx::_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
              *)local_268,
             (hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             auStack_e8,(value_type *)local_a0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
      operator<<((ostream *)local_268,
                 (hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                 auStack_e8);
      std::__cxx11::stringbuf::str();
      p_Var2 = copied_v.
               super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
               .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
               super__Safe_sequence_base._M_iterators;
      std::__cxx11::string::~string((string *)local_a0);
      if (p_Var2 == (_Safe_iterator_base *)0x8) {
        std::__cxx11::stringbuf::str();
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "10",0);
        std::__cxx11::string::~string((string *)local_a0);
        if (sVar6 == 0xffffffffffffffff) {
LAB_00116f51:
          pcVar9 = "ss.str().find(\"10\") != string::npos";
        }
        else {
          std::__cxx11::stringbuf::str();
          sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,"20",0);
          std::__cxx11::string::~string((string *)local_a0);
          if (sVar6 == 0xffffffffffffffff) {
LAB_00116f6b:
            pcVar9 = "ss.str().find(\"20\") != string::npos";
          }
          else {
            std::__cxx11::stringbuf::str();
            sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0,"30",0);
            std::__cxx11::string::~string((string *)local_a0);
            if (sVar6 == 0xffffffffffffffff) {
LAB_00116f85:
              pcVar9 = "ss.str().find(\"30\") != string::npos";
            }
            else {
              __gnu_cxx::
              hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::hashtable((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)local_a0,
                          (hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)auStack_e8);
              psVar4 = google::
                       Check_EQImpl<__gnu_cxx::hash_set<int,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<int>>,__gnu_cxx::hash_set<int,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<int>>>
                                 ((hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                   *)auStack_e8,
                                  (hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                   *)local_a0,"hs == copied_hs");
              if (psVar4 != (string *)0x0) {
                local_58.str_ = psVar4;
                google::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_50,
                           "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                           ,0x73,&local_58);
                google::LogMessage::stream((LogMessage *)&local_50);
                goto LAB_001171c4;
              }
              __gnu_cxx::
              hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::~hashtable((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                            *)local_a0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
              __gnu_cxx::
              hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::~hashtable((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                            *)auStack_e8);
              __gnu_cxx::
              hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::hash_map((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_e8);
              local_268._0_4_ = 10;
              pbVar7 = __gnu_cxx::
                       hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)auStack_e8,(key_type *)local_268);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              assign(pbVar7,"ten");
              local_268._0_4_ = 0x14;
              pbVar7 = __gnu_cxx::
                       hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)auStack_e8,(key_type *)local_268);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              assign(pbVar7,"twenty");
              local_268._0_4_ = 0x1e;
              pbVar7 = __gnu_cxx::
                       hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)auStack_e8,(key_type *)local_268);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              assign(pbVar7,"thirty");
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
              operator<<((ostream *)local_268,
                         (hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_e8);
              std::__cxx11::stringbuf::str();
              p_Var2 = copied_v.
                       super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                       .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                       super__Safe_sequence_base._M_iterators;
              std::__cxx11::string::~string((string *)local_a0);
              if (p_Var2 != (_Safe_iterator_base *)0x23) {
                pcVar9 = "ss.str().size()";
                pcVar10 = "35";
                goto LAB_00117158;
              }
              std::__cxx11::stringbuf::str();
              sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a0,"(10, ten)",0);
              std::__cxx11::string::~string((string *)local_a0);
              if (sVar6 == 0xffffffffffffffff) {
                pcVar9 = "ss.str().find(\"(10, ten)\") != string::npos";
              }
              else {
                std::__cxx11::stringbuf::str();
                sVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a0,"(20, twenty)",0);
                std::__cxx11::string::~string((string *)local_a0);
                if (sVar6 == 0xffffffffffffffff) {
                  pcVar9 = "ss.str().find(\"(20, twenty)\") != string::npos";
                }
                else {
                  std::__cxx11::stringbuf::str();
                  sVar6 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a0,"(30, thirty)",0);
                  std::__cxx11::string::~string((string *)local_a0);
                  if (sVar6 != 0xffffffffffffffff) {
                    __gnu_cxx::
                    hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::hashtable((hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_a0,
                                (hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)auStack_e8);
                    local_58.str_ =
                         google::
                         Check_EQImpl<__gnu_cxx::hash_map<int,std::__cxx11::string,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<std::__cxx11::string>>,__gnu_cxx::hash_map<int,std::__cxx11::string,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<std::__cxx11::string>>>
                                   ((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)auStack_e8,
                                    (hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_a0,"hm == copied_hm");
                    if (local_58.str_ != (string *)0x0) {
                      google::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)&local_50,
                                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                                 ,0x85,&local_58);
                      google::LogMessage::stream((LogMessage *)&local_50);
LAB_001171c4:
                      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
                    }
                    __gnu_cxx::
                    hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~hashtable((hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_a0);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
                    __gnu_cxx::
                    hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~hashtable((hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)auStack_e8);
                    std::__debug::vector<int,_std::allocator<int>_>::vector
                              ((vector<int,_std::allocator<int>_> *)auStack_e8);
                    local_a0 = (undefined1  [8])
                               &copied_v.
                                super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                                .
                                super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>
                                .super__Safe_sequence_base._M_const_iterators;
                    copied_v.
                    super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                    .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                    super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
                    copied_v.
                    super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                    .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                    super__Safe_sequence_base._M_const_iterators._0_1_ = 0;
                    for (local_50._M_dataplus._M_p._0_4_ = 0;
                        (int)(uint)local_50._M_dataplus._M_p < 100;
                        local_50._M_dataplus._M_p._0_4_ = (uint)local_50._M_dataplus._M_p + 1) {
                      std::__debug::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)&local_50);
                      if (0 < (int)(uint)local_50._M_dataplus._M_p) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a0,' ');
                      }
                      snprintf((char *)local_268,0x100,"%d",(ulong)(uint)local_50._M_dataplus._M_p);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a0,(char *)local_268);
                    }
                    local_268._0_4_ = 100;
                    std::__debug::vector<int,_std::allocator<int>_>::emplace_back<int>
                              ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)local_268);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0," ...");
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
                    operator<<((ostream *)local_268,(vector<int,_std::allocator<int>_> *)auStack_e8)
                    ;
                    std::__cxx11::stringbuf::str();
                    local_58.str_ = (string *)local_a0;
                    psVar4 = google::Check_EQImpl<std::__cxx11::string,char_const*>
                                       (&local_50,(char **)&local_58,"ss.str() == expected.c_str()")
                    ;
                    std::__cxx11::string::~string((string *)&local_50);
                    if (psVar4 != (string *)0x0) {
                      local_58.str_ = psVar4;
                      google::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)&local_50,
                                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                                 ,0x99,&local_58);
                      google::LogMessage::stream((LogMessage *)&local_50);
                      goto LAB_001171c4;
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
                    std::__cxx11::string::~string((string *)local_a0);
                    std::__debug::vector<int,_std::allocator<int>_>::~vector
                              ((vector<int,_std::allocator<int>_> *)auStack_e8);
                    v.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage = (pointer)&v.super_vector<int,_std::allocator<int>_>;
                    local_268._0_4_ = 0x14;
                    auStack_e8 = (undefined1  [8])0x0;
                    v.
                    super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                    .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                    super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
                    v.
                    super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                    .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                    super__Safe_sequence_base._M_const_iterators._0_4_ = 1;
                    v.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start._0_4_ = 0;
                    v.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish = (pointer)0x0;
                    puVar1 = &v.
                              super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                              .
                              super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>
                              .super__Safe_sequence_base._M_version;
                    v.
                    super__Safe_vector<std::__debug::vector<int,_std::allocator<int>_>,_std::__cxx1998::vector<int,_std::allocator<int>_>_>
                    ._M_guaranteed_capacity =
                         (size_type)
                         v.super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                    pmVar8 = std::__cxx1998::
                             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)puVar1,(key_type *)local_268);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::assign(pmVar8,"twenty");
                    local_268._0_4_ = 10;
                    pmVar8 = std::__cxx1998::
                             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)puVar1,(key_type *)local_268);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::assign(pmVar8,"ten");
                    local_268._0_4_ = 0x1e;
                    pmVar8 = std::__cxx1998::
                             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)puVar1,(key_type *)local_268);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::assign(pmVar8,"thirty");
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
                    operator<<((ostream *)local_268,
                               (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)auStack_e8);
                    std::__cxx11::stringbuf::str();
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_a0,"(30, thirty) (20, twenty) (10, ten)");
                    std::__cxx11::string::~string((string *)local_a0);
                    if (bVar3) {
                      std::__debug::
                      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_a0,
                            (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)auStack_e8);
                      psVar4 = google::
                               Check_EQImpl<std::__debug::map<int,std::__cxx11::string,std::greater<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>,std::__debug::map<int,std::__cxx11::string,std::greater<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                                         ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)auStack_e8,
                                          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_a0,"m == copied_m");
                      if (psVar4 != (string *)0x0) {
                        local_58.str_ = psVar4;
                        google::LogMessageFatal::LogMessageFatal
                                  ((LogMessageFatal *)&local_50,
                                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                                   ,0xa7,&local_58);
                        google::LogMessage::stream((LogMessage *)&local_50);
                        goto LAB_001171c4;
                      }
                      std::__debug::
                      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_a0);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
                      std::__debug::
                      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)auStack_e8);
                      __gnu_cxx::hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                      ::hash_set((hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                                  *)auStack_e8);
                      local_a0._0_4_ = 10;
                      __gnu_cxx::hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                      ::insert((pair<__gnu_cxx::_Hashtable_const_iterator<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
                                *)local_268,
                               (hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_> *
                               )auStack_e8,(value_type *)local_a0);
                      local_a0._0_4_ = 0x14;
                      __gnu_cxx::hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                      ::insert((pair<__gnu_cxx::_Hashtable_const_iterator<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
                                *)local_268,
                               (hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_> *
                               )auStack_e8,(value_type *)local_a0);
                      local_a0._0_4_ = 0x1e;
                      __gnu_cxx::hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                      ::insert((pair<__gnu_cxx::_Hashtable_const_iterator<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
                                *)local_268,
                               (hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_> *
                               )auStack_e8,(value_type *)local_a0);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
                      operator<<((ostream *)local_268,
                                 (hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                                  *)auStack_e8);
                      std::__cxx11::stringbuf::str();
                      p_Var2 = copied_v.
                               super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                               .
                               super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>
                               .super__Safe_sequence_base._M_iterators;
                      std::__cxx11::string::~string((string *)local_a0);
                      if (p_Var2 != (_Safe_iterator_base *)0x8) goto LAB_00116f29;
                      std::__cxx11::stringbuf::str();
                      sVar6 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a0,"10",0);
                      std::__cxx11::string::~string((string *)local_a0);
                      if (sVar6 == 0xffffffffffffffff) goto LAB_00116f51;
                      std::__cxx11::stringbuf::str();
                      sVar6 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a0,"20",0);
                      std::__cxx11::string::~string((string *)local_a0);
                      if (sVar6 == 0xffffffffffffffff) goto LAB_00116f6b;
                      std::__cxx11::stringbuf::str();
                      sVar6 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a0,"30",0);
                      std::__cxx11::string::~string((string *)local_a0);
                      if (sVar6 != 0xffffffffffffffff) {
                        __gnu_cxx::
                        hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                        ::hashtable((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                                     *)local_a0,
                                    (hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                                     *)auStack_e8);
                        psVar4 = google::
                                 Check_EQImpl<__gnu_cxx::hash_set<int,user_hash,std::equal_to<int>,std::allocator<int>>,__gnu_cxx::hash_set<int,user_hash,std::equal_to<int>,std::allocator<int>>>
                                           ((hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                                             *)auStack_e8,
                                            (hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                                             *)local_a0,"hs == copied_hs");
                        if (psVar4 == (string *)0x0) {
                          __gnu_cxx::
                          hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                          ::~hashtable((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                                        *)local_a0);
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
                          __gnu_cxx::
                          hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                          ::~hashtable((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                                        *)auStack_e8);
                          std::operator<<((ostream *)&std::cout,"PASS\n");
                          return 0;
                        }
                        local_58.str_ = psVar4;
                        google::LogMessageFatal::LogMessageFatal
                                  ((LogMessageFatal *)&local_50,
                                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                                   ,0xb9,&local_58);
                        google::LogMessage::stream((LogMessage *)&local_50);
                        goto LAB_001171c4;
                      }
                      goto LAB_00116f85;
                    }
                    pcVar9 = "ss.str()";
                    pcVar10 = "\"(30, thirty) (20, twenty) (10, ten)\"";
                    goto LAB_00117158;
                  }
                  pcVar9 = "ss.str().find(\"(30, thirty)\") != string::npos";
                }
              }
            }
          }
        }
        fprintf(_stderr,"Check failed: %s\n",pcVar9);
        goto LAB_00117162;
      }
LAB_00116f29:
      pcVar9 = "ss.str().size()";
      pcVar10 = "8";
    }
    else {
      pcVar9 = "ss.str()";
      pcVar10 = "\"(10, ten) (20, twenty) (30, thirty)\"";
    }
  }
  else {
    pcVar9 = "ss.str()";
    pcVar10 = "\"10 20 30\"";
  }
LAB_00117158:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar9,"==",pcVar10);
LAB_00117162:
  exit(1);
}

Assistant:

int main(int, char**) {
  TestSTLLogging();
  std::cout << "PASS\n";
  return 0;
}